

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubwordLearner.cc
# Opt level: O1

void __thiscall
onmt::SubwordLearner::learn(SubwordLearner *this,string *model_path,char *description,bool verbose)

{
  invalid_argument *this_00;
  ofstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_248;
  long local_228;
  filebuf local_220 [24];
  byte abStack_208 [216];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,(string *)model_path,_S_out);
  if ((abStack_208[*(long *)(local_228 + -0x18)] & 5) == 0) {
    (*this->_vptr_SubwordLearner[6])(this,&local_228,description,(ulong)verbose);
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(local_130);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_248,"Failed to open model path ",model_path);
  std::invalid_argument::invalid_argument(this_00,(string *)&bStack_248);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void SubwordLearner::learn(const std::string& model_path, const char* description, bool verbose)
  {
    std::ofstream out(model_path);
    if (!out)
      throw std::invalid_argument("Failed to open model path " + model_path);
    learn(out, description, verbose);
  }